

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdapi_elements_transaction.cpp
# Opt level: O3

void __thiscall
ElementsTransactionApi_FundRawTransaction_emptyUtxo_Test::TestBody
          (ElementsTransactionApi_FundRawTransaction_emptyUtxo_Test *this)

{
  _func_int **pp_Var1;
  pointer *ppuVar2;
  bool bVar3;
  undefined4 uVar4;
  undefined1 extraout_DL;
  char *pcVar5;
  ConfidentialTransactionController ctx;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  selected_txin_utxos;
  ElementsTransactionApi api;
  UtxoFilter filter;
  ConfidentialAssetId asset;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  append_txout_addresses;
  AssertionResult gtest_ar;
  ConfidentialAssetId fee_asset;
  ConfidentialTransactionContext txc;
  Amount estimate_fee;
  CoinSelectionOption option;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  map_target_value;
  ElementsAddressFactory factory;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  reserve_txout_address;
  Script claim_script;
  Transaction tx;
  ElementsUtxoAndOption utxo_data1;
  UtxoData utxo1;
  undefined4 in_stack_fffffffffffff15c;
  undefined4 in_stack_fffffffffffff184;
  AssertHelper local_e68 [2];
  undefined1 local_e58 [16];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e48;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e40;
  ConfidentialTransaction local_e38 [64];
  undefined1 local_df8 [24];
  pointer local_de0;
  vector local_dd4 [4];
  ConfidentialAssetId local_dd0;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_da8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d88;
  Message local_d68;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d60;
  undefined1 local_d58 [168];
  ConfidentialAssetId local_cb0;
  ConfidentialAssetId local_c88 [4];
  Amount local_bd0 [16];
  ConfidentialAssetId local_bc0;
  undefined **local_b88;
  void *local_b80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  local_b58;
  undefined **local_b28 [2];
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> local_b18 [24]
  ;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b00;
  Script local_ad0;
  Transaction local_a98 [64];
  undefined1 local_a58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a48;
  uchar local_a38 [16];
  void *local_a28;
  void *local_a10;
  void *local_9f8;
  code *local_9e0 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_968;
  Script local_950;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_910 [19];
  undefined2 local_568;
  bool local_566;
  uint32_t local_564;
  Script local_560;
  uint32_t local_528;
  undefined8 local_520 [5];
  Txid local_4f8;
  undefined4 local_4d8;
  Script local_4d0 [2];
  Address local_460 [376];
  undefined1 local_2e8 [8];
  char *local_2e0;
  _func_int **local_2c8;
  undefined1 local_2c0;
  undefined4 local_2b8;
  undefined8 local_2b0;
  ConfidentialAssetId local_2a8 [15];
  
  cfd::Initialize();
  cfd::ElementsAddressFactory::ElementsAddressFactory((ElementsAddressFactory *)local_b28,kLiquidV1)
  ;
  pp_Var1 = (_func_int **)(local_a58 + 0x10);
  local_a58._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a58,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",
             "");
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_dd0,(string *)local_a58);
  if ((_func_int **)local_a58._0_8_ != pp_Var1) {
    operator_delete((void *)local_a58._0_8_);
  }
  cfd::UtxoData::UtxoData((UtxoData *)local_520);
  local_520[0] = 0;
  local_2b0 = 0;
  ppuVar2 = (pointer *)
            ((long)&local_c88[0].data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data + 8);
  local_c88[0]._vptr_ConfidentialAssetId = (_func_int **)ppuVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c88,"5e5fd4e860d999b30b268ed583dfcfe805c395f8290d8307f6617fdc3f029de3",
             "");
  cfd::core::Txid::Txid((Txid *)local_a58,(string *)local_c88);
  cfd::core::Txid::operator=(&local_4f8,(Txid *)local_a58);
  local_a58._0_8_ = &PTR__Txid_002dbe60;
  if ((void *)CONCAT71(local_a58._9_7_,local_a58[8]) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_a58._9_7_,local_a58[8]));
  }
  if (local_c88[0]._vptr_ConfidentialAssetId != (_func_int **)ppuVar2) {
    operator_delete(local_c88[0]._vptr_ConfidentialAssetId);
  }
  local_4d8 = 0;
  local_c88[0]._vptr_ConfidentialAssetId = (_func_int **)ppuVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c88,"0014860d7bed1010c2ccb5247889daa5c58023fa9f8d","");
  cfd::core::Script::Script((Script *)local_a58,(string *)local_c88);
  cfd::core::Script::operator=(local_4d0,(Script *)local_a58);
  cfd::core::Script::~Script((Script *)local_a58);
  if (local_c88[0]._vptr_ConfidentialAssetId != (_func_int **)ppuVar2) {
    operator_delete(local_c88[0]._vptr_ConfidentialAssetId);
  }
  local_c88[0]._vptr_ConfidentialAssetId = (_func_int **)ppuVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c88,"ert1qscxhhmgszrpvedfy0zya4fw9sq3l48udr728gs","");
  cfd::AddressFactory::GetAddress((string *)local_a58);
  cfd::core::Address::operator=(local_460,(Address *)local_a58);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(local_910);
  cfd::core::Script::~Script(&local_950);
  local_9e0[0] = cfd::core::Psbt::CheckTxInIndex;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_968);
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_9e0);
  if (local_9f8 != (void *)0x0) {
    operator_delete(local_9f8);
  }
  if (local_a10 != (void *)0x0) {
    operator_delete(local_a10);
  }
  if (local_a28 != (void *)0x0) {
    operator_delete(local_a28);
  }
  if ((uchar *)local_a48._M_allocated_capacity != local_a38) {
    operator_delete((void *)local_a48._M_allocated_capacity);
  }
  if (local_c88[0]._vptr_ConfidentialAssetId != (_func_int **)ppuVar2) {
    operator_delete(local_c88[0]._vptr_ConfidentialAssetId);
  }
  std::__cxx11::string::_M_replace((ulong)local_2e8,0,local_2e0,0x28ace0);
  cfd::core::Amount::Amount((Amount *)local_a58,0x5f5df0c);
  local_2c0 = local_a58[8];
  local_2c8 = (_func_int **)local_a58._0_8_;
  local_2b8 = 4;
  cfd::core::ConfidentialAssetId::operator=(local_2a8,&local_dd0);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_cb0,&local_dd0);
  local_b58._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_b58._M_impl.super__Rb_tree_header._M_header;
  local_b58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_b58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b58._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b58._M_impl.super__Rb_tree_header._M_header._M_right =
       local_b58._M_impl.super__Rb_tree_header._M_header._M_left;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  cfd::core::Amount::Amount((Amount *)local_c88);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
  ::_M_emplace_unique<std::__cxx11::string,cfd::core::Amount>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
              *)&local_b58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a58,
             (Amount *)local_c88);
  if ((_func_int **)local_a58._0_8_ != pp_Var1) {
    operator_delete((void *)local_a58._0_8_);
  }
  local_b00._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_b00._M_impl.super__Rb_tree_header._M_header;
  local_b00._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_b00._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b00._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b00._M_impl.super__Rb_tree_header._M_header._M_right =
       local_b00._M_impl.super__Rb_tree_header._M_header._M_left;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::__cxx11::string,char_const(&)[102]>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&local_b00,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a58,
             (char (*) [102])
             "el1qqtl9a3n6878ex25u0wv8u5qlzpfkycc0cftk65t52pkauk55jqka0fajk8d80lafn4t9kqxe77cu9ez2dyr6sq54lwy009uex"
            );
  if ((_func_int **)local_a58._0_8_ != pp_Var1) {
    operator_delete((void *)local_a58._0_8_);
  }
  local_df8._0_8_ = (pointer)0x0;
  local_df8._8_8_ = (pointer)0x0;
  local_df8._16_8_ = (pointer)0x0;
  cfd::core::Amount::Amount(local_bd0);
  local_d88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::CoinSelectionOption::CoinSelectionOption((CoinSelectionOption *)&local_bc0);
  cfd::CoinSelectionOption::InitializeConfidentialTxSizeInfo();
  cfd::CoinSelectionOption::SetEffectiveFeeBaserate(0.15);
  cfd::CoinSelectionOption::SetLongTermFeeBaserate(0.15);
  cfd::CoinSelectionOption::SetFeeAsset(&local_bc0);
  cfd::CoinSelectionOption::SetBlindInfo((int)&local_bc0,0);
  cfd::CoinSelectionOption::SetKnapsackMinimumChange((long)&local_bc0);
  local_a58._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a58,
             "020000000101e39d023fdc7f61f607830d29f895c305e8cfdf83d58e260bb399d960e8d45f5e0000004000ffffffff000000000000000006080cdff505000000002025b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f160014f3ea0aba73fdb23912ebd21f46e156cdd9e94280c0020000000001014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000ffffffff010cdff5050000000017a9141500eb4946dee5979e708c8b2c6d090773f3b8d1870247304402204d9faa0b3b9c76b3ee875ae9205b50e05c2d0a8dff8e26d269f68eb72531af1402201f71d1e2bec6b7ea90d45dec158d3f85942e0fc09cfad29d917d3cbc6acd981d012103b64236b2c8f34a18e3a584fe0877fb944e2abb4544cb14bee5458bcc2480cefc000000009700000020fe3b574c1ce6d5cb68fc518e86f7976e599fafc0a2e5754aace7ca16d97a7c78ef9325b8d4f0a4921e060fc5e71435f46a18fa339688142cd4b028c8488c9f8dd1495b5dffff7f200200000002000000024a180a6822abffc3b1080c49016899c6dac25083936df14af12f58db11958ef27926299350fdc2f4d0da1d4f0fbbd3789d29f9dc016358ae42463c0cebf393f30105"
             ,"");
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)local_c88,(string *)local_a58);
  if ((_func_int **)local_a58._0_8_ != pp_Var1) {
    operator_delete((void *)local_a58._0_8_);
  }
  local_a58._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a58,
             "020000000001014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000ffffffff010cdff5050000000017a9141500eb4946dee5979e708c8b2c6d090773f3b8d1870247304402204d9faa0b3b9c76b3ee875ae9205b50e05c2d0a8dff8e26d269f68eb72531af1402201f71d1e2bec6b7ea90d45dec158d3f85942e0fc09cfad29d917d3cbc6acd981d012103b64236b2c8f34a18e3a584fe0877fb944e2abb4544cb14bee5458bcc2480cefc00000000"
             ,"");
  cfd::core::Transaction::Transaction(local_a98,(string *)local_a58);
  if ((_func_int **)local_a58._0_8_ != pp_Var1) {
    operator_delete((void *)local_a58._0_8_);
  }
  local_a58._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a58,"0014f3ea0aba73fdb23912ebd21f46e156cdd9e94280","");
  cfd::core::Script::Script(&local_ad0,(string *)local_a58);
  if ((_func_int **)local_a58._0_8_ != pp_Var1) {
    operator_delete((void *)local_a58._0_8_);
  }
  local_da8.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_da8.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_da8.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::UtxoData::UtxoData((UtxoData *)local_a58);
  local_568._0_1_ = false;
  local_568._1_1_ = false;
  local_566 = false;
  local_564 = 0;
  cfd::core::Script::Script(&local_560);
  local_528 = 0;
  cfd::UtxoData::operator=((UtxoData *)local_a58,(UtxoData *)local_520);
  local_566 = true;
  cfd::core::Script::operator=(&local_560,&local_ad0);
  local_564 = cfd::core::Transaction::GetTotalSize();
  local_528 = 0xfa;
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  push_back((vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
             *)local_df8,(value_type *)local_a58);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  cfd::api::ElementsTransactionApi::FundRawTransaction
            ((string *)&local_e48,(vector *)&local_de0,(map *)&local_d68,(vector *)&local_da8,
             (map *)&local_b58,(ConfidentialAssetId *)local_df8,false,0.15,(Amount *)&local_cb0,
             (UtxoFilter *)CONCAT44(in_stack_fffffffffffff15c,1),(CoinSelectionOption *)local_bd0,
             local_dd4,(NetType)&local_bc0,(vector *)&local_d88,
             (Amount *)CONCAT44(in_stack_fffffffffffff184,4));
  if ((undefined1 *)CONCAT71(local_d68.ss_.ptr_._1_7_,local_d68.ss_.ptr_._0_1_) != local_d58) {
    operator_delete((undefined1 *)CONCAT71(local_d68.ss_.ptr_._1_7_,local_d68.ss_.ptr_._0_1_));
  }
  cfd::AbstractTransactionController::GetHex_abi_cxx11_();
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)&local_d68,(string *)local_e68);
  cfd::ConfidentialTransactionContext::operator=
            ((ConfidentialTransactionContext *)local_c88,
             (ConfidentialTransactionContext *)&local_d68);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)&local_d68);
  if (local_e68[0].data_ != (AssertHelperData *)local_e58) {
    operator_delete(local_e68[0].data_);
  }
  local_e48.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &PTR__ConfidentialTransactionController_002dbde8;
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction(local_e38);
  local_e48.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       cfd::ConfidentialTransactionContext::GetFeeAmount(local_c88);
  local_e40.ptr_._0_1_ = extraout_DL;
  local_e68[0].data_ = (AssertHelperData *)cfd::core::Amount::GetSatoshiValue();
  local_de0 = (pointer)cfd::core::Amount::GetSatoshiValue();
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)&local_d68,"txc.GetFeeAmount().GetSatoshiValue()",
             "estimate_fee.GetSatoshiValue()",(long *)local_e68,(long *)&local_de0);
  if (local_d68.ss_.ptr_._0_1_ == (map)0x0) {
    testing::Message::Message((Message *)&local_e48);
    if (local_d60.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_d60.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_e68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x56f,pcVar5);
    testing::internal::AssertHelper::operator=(local_e68,(Message *)&local_e48);
    testing::internal::AssertHelper::~AssertHelper(local_e68);
    if (local_e48.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_e48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_e48.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_d60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_e48,"txc.GetHex().c_str()",
             "\"020000000101e39d023fdc7f61f607830d29f895c305e8cfdf83d58e260bb399d960e8d45f5e0000004000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000000d500000125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000005f5de3702fe5ec67a3f8f932a9c7b987e501f105362630fc2576d5174506dde5a94902dd7160014a7b2b1da77ffa99d565b00d9f7b1c2e44a6907a80000000000000006080cdff505000000002025b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f160014f3ea0aba73fdb23912ebd21f46e156cdd9e94280c0020000000001014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000ffffffff010cdff5050000000017a9141500eb4946dee5979e708c8b2c6d090773f3b8d1870247304402204d9faa0b3b9c76b3ee875ae9205b50e05c2d0a8dff8e26d269f68eb72531af1402201f71d1e2bec6b7ea90d45dec158d3f85942e0fc09cfad29d917d3cbc6acd981d012103b64236b2c8f34a18e3a584fe0877fb944e2abb4544cb14bee5458bcc2480cefc000000009700000020fe3b574c1ce6d5cb68fc518e86f7976e599fafc0a2e5754aace7ca16d97a7c78ef9325b8d4f0a4921e060fc5e71435f46a18fa339688142cd4b028c8488c9f8dd1495b5dffff7f200200000002000000024a180a6822abffc3b1080c49016899c6dac25083936df14af12f58db11958ef27926299350fdc2f4d0da1d4f0fbbd3789d29f9dc016358ae42463c0cebf393f3010500000000\""
             ,(char *)CONCAT71(local_d68.ss_.ptr_._1_7_,local_d68.ss_.ptr_._0_1_),
             "020000000101e39d023fdc7f61f607830d29f895c305e8cfdf83d58e260bb399d960e8d45f5e0000004000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000000d500000125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000005f5de3702fe5ec67a3f8f932a9c7b987e501f105362630fc2576d5174506dde5a94902dd7160014a7b2b1da77ffa99d565b00d9f7b1c2e44a6907a80000000000000006080cdff505000000002025b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f160014f3ea0aba73fdb23912ebd21f46e156cdd9e94280c0020000000001014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000ffffffff010cdff5050000000017a9141500eb4946dee5979e708c8b2c6d090773f3b8d1870247304402204d9faa0b3b9c76b3ee875ae9205b50e05c2d0a8dff8e26d269f68eb72531af1402201f71d1e2bec6b7ea90d45dec158d3f85942e0fc09cfad29d917d3cbc6acd981d012103b64236b2c8f34a18e3a584fe0877fb944e2abb4544cb14bee5458bcc2480cefc000000009700000020fe3b574c1ce6d5cb68fc518e86f7976e599fafc0a2e5754aace7ca16d97a7c78ef9325b8d4f0a4921e060fc5e71435f46a18fa339688142cd4b028c8488c9f8dd1495b5dffff7f200200000002000000024a180a6822abffc3b1080c49016899c6dac25083936df14af12f58db11958ef27926299350fdc2f4d0da1d4f0fbbd3789d29f9dc016358ae42463c0cebf393f3010500000000"
            );
  if ((undefined1 *)CONCAT71(local_d68.ss_.ptr_._1_7_,local_d68.ss_.ptr_._0_1_) != local_d58) {
    operator_delete((undefined1 *)CONCAT71(local_d68.ss_.ptr_._1_7_,local_d68.ss_.ptr_._0_1_));
  }
  if (local_e48.ptr_._0_1_ == (string)0x0) {
    testing::Message::Message(&local_d68);
    if ((undefined8 *)CONCAT71(local_e40.ptr_._1_7_,local_e40.ptr_._0_1_) == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)CONCAT71(local_e40.ptr_._1_7_,local_e40.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              (local_e68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x570,pcVar5);
    testing::internal::AssertHelper::operator=(local_e68,&local_d68);
    testing::internal::AssertHelper::~AssertHelper(local_e68);
    if (CONCAT71(local_d68.ss_.ptr_._1_7_,local_d68.ss_.ptr_._0_1_) != 0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((long *)CONCAT71(local_d68.ss_.ptr_._1_7_,local_d68.ss_.ptr_._0_1_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_d68.ss_.ptr_._1_7_,local_d68.ss_.ptr_._0_1_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_e40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar4 = cfd::core::ConfidentialTransaction::GetVsize();
  local_e48.ptr_._0_4_ = uVar4;
  local_e68[0].data_._0_4_ = 0x133;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_d68,"txc.GetVsize()","307",(uint *)&local_e48,(int *)local_e68);
  if (local_d68.ss_.ptr_._0_1_ == (map)0x0) {
    testing::Message::Message((Message *)&local_e48);
    if (local_d60.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_d60.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_e68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x571,pcVar5);
    testing::internal::AssertHelper::operator=(local_e68,(Message *)&local_e48);
    testing::internal::AssertHelper::~AssertHelper(local_e68);
    if (local_e48.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_e48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_e48.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_d60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Script::~Script(&local_560);
  cfd::UtxoData::~UtxoData((UtxoData *)local_a58);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&local_da8);
  cfd::core::Script::~Script(&local_ad0);
  cfd::core::Transaction::~Transaction(local_a98);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)local_c88);
  local_b88 = &PTR__ConfidentialAssetId_002dc170;
  if (local_b80 != (void *)0x0) {
    operator_delete(local_b80);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d88);
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  ~vector((vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
           *)local_df8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_b00);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  ::~_Rb_tree(&local_b58);
  local_cb0._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_002dc170;
  if (local_cb0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_cb0.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  cfd::UtxoData::~UtxoData((UtxoData *)local_520);
  local_dd0._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_002dc170;
  if (local_dd0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_dd0.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_b28[0] = &PTR__AddressFactory_002d9fd8;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (local_b18);
  return;
}

Assistant:

TEST(ElementsTransactionApi, FundRawTransaction_emptyUtxo) {
  cfd::Initialize();
  ElementsAddressFactory factory(NetType::kLiquidV1);
  ConfidentialAssetId asset("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");
  // Address1
  UtxoData utxo1;
  utxo1.block_height = 0;
  utxo1.binary_data = nullptr;
  utxo1.txid = Txid("5e5fd4e860d999b30b268ed583dfcfe805c395f8290d8307f6617fdc3f029de3");
  utxo1.vout = 0;
  utxo1.locking_script = Script("0014860d7bed1010c2ccb5247889daa5c58023fa9f8d");
  // utxo1.redeem_script = Script("");
  utxo1.address = factory.GetAddress("ert1qscxhhmgszrpvedfy0zya4fw9sq3l48udr728gs");
  utxo1.descriptor = "wpkh(02db28ad892aa1e500d1e88ffa24200088bc82a8a87807cd13a1d1a1c7799c41e5)";
  utxo1.amount = Amount(int64_t{99999500});
  utxo1.address_type = AddressType::kP2wpkhAddress;
  utxo1.asset = asset;

  double fee_rate = 0.15;
  ConfidentialAssetId fee_asset = asset;
  std::map<std::string, Amount> map_target_value;
  map_target_value.emplace(asset.GetHex(), Amount());
  std::map<std::string, std::string> reserve_txout_address;
  reserve_txout_address.emplace(asset.GetHex(), "el1qqtl9a3n6878ex25u0wv8u5qlzpfkycc0cftk65t52pkauk55jqka0fajk8d80lafn4t9kqxe77cu9ez2dyr6sq54lwy009uex");
  std::vector<ElementsUtxoAndOption> selected_txin_utxos;
  Amount estimate_fee;
  UtxoFilter filter;
  std::vector<std::string> append_txout_addresses;
  CoinSelectionOption option;
  option.InitializeConfidentialTxSizeInfo();
  option.SetEffectiveFeeBaserate(fee_rate);
  option.SetLongTermFeeBaserate(fee_rate);
  option.SetFeeAsset(fee_asset);
  option.SetBlindInfo(0, 52);
  option.SetKnapsackMinimumChange(0);

  ConfidentialTransactionContext txc("020000000101e39d023fdc7f61f607830d29f895c305e8cfdf83d58e260bb399d960e8d45f5e0000004000ffffffff000000000000000006080cdff505000000002025b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f160014f3ea0aba73fdb23912ebd21f46e156cdd9e94280c0020000000001014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000ffffffff010cdff5050000000017a9141500eb4946dee5979e708c8b2c6d090773f3b8d1870247304402204d9faa0b3b9c76b3ee875ae9205b50e05c2d0a8dff8e26d269f68eb72531af1402201f71d1e2bec6b7ea90d45dec158d3f85942e0fc09cfad29d917d3cbc6acd981d012103b64236b2c8f34a18e3a584fe0877fb944e2abb4544cb14bee5458bcc2480cefc000000009700000020fe3b574c1ce6d5cb68fc518e86f7976e599fafc0a2e5754aace7ca16d97a7c78ef9325b8d4f0a4921e060fc5e71435f46a18fa339688142cd4b028c8488c9f8dd1495b5dffff7f200200000002000000024a180a6822abffc3b1080c49016899c6dac25083936df14af12f58db11958ef27926299350fdc2f4d0da1d4f0fbbd3789d29f9dc016358ae42463c0cebf393f30105");
  cfd::core::Transaction tx(
    "020000000001014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000ffffffff010cdff5050000000017a9141500eb4946dee5979e708c8b2c6d090773f3b8d1870247304402204d9faa0b3b9c76b3ee875ae9205b50e05c2d0a8dff8e26d269f68eb72531af1402201f71d1e2bec6b7ea90d45dec158d3f85942e0fc09cfad29d917d3cbc6acd981d012103b64236b2c8f34a18e3a584fe0877fb944e2abb4544cb14bee5458bcc2480cefc00000000");
  Script claim_script("0014f3ea0aba73fdb23912ebd21f46e156cdd9e94280");
  std::vector<cfd::UtxoData> utxos;
  ElementsUtxoAndOption utxo_data1;
  utxo_data1.utxo = utxo1;
  utxo_data1.is_pegin = true;
  utxo_data1.claim_script = claim_script;
  utxo_data1.pegin_btc_tx_size = tx.GetTotalSize();
  utxo_data1.pegin_txoutproof_size = 250;  // dummy
  selected_txin_utxos.push_back(utxo_data1);

  try {
    ElementsTransactionApi api;
    ConfidentialTransactionController ctx = api.FundRawTransaction(
        txc.GetHex(), utxos, map_target_value, selected_txin_utxos,
        reserve_txout_address, fee_asset, true, fee_rate, &estimate_fee,
        &filter, &option, &append_txout_addresses, NetType::kElementsRegtest);
    txc = ConfidentialTransactionContext(ctx.GetHex());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  EXPECT_EQ(txc.GetFeeAmount().GetSatoshiValue(), estimate_fee.GetSatoshiValue());
  EXPECT_STREQ(txc.GetHex().c_str(), "020000000101e39d023fdc7f61f607830d29f895c305e8cfdf83d58e260bb399d960e8d45f5e0000004000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000000d500000125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000005f5de3702fe5ec67a3f8f932a9c7b987e501f105362630fc2576d5174506dde5a94902dd7160014a7b2b1da77ffa99d565b00d9f7b1c2e44a6907a80000000000000006080cdff505000000002025b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f160014f3ea0aba73fdb23912ebd21f46e156cdd9e94280c0020000000001014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000ffffffff010cdff5050000000017a9141500eb4946dee5979e708c8b2c6d090773f3b8d1870247304402204d9faa0b3b9c76b3ee875ae9205b50e05c2d0a8dff8e26d269f68eb72531af1402201f71d1e2bec6b7ea90d45dec158d3f85942e0fc09cfad29d917d3cbc6acd981d012103b64236b2c8f34a18e3a584fe0877fb944e2abb4544cb14bee5458bcc2480cefc000000009700000020fe3b574c1ce6d5cb68fc518e86f7976e599fafc0a2e5754aace7ca16d97a7c78ef9325b8d4f0a4921e060fc5e71435f46a18fa339688142cd4b028c8488c9f8dd1495b5dffff7f200200000002000000024a180a6822abffc3b1080c49016899c6dac25083936df14af12f58db11958ef27926299350fdc2f4d0da1d4f0fbbd3789d29f9dc016358ae42463c0cebf393f3010500000000");
  EXPECT_EQ(txc.GetVsize(), 307);
}